

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

ssize_t __thiscall RunWriter::write(RunWriter *this,int __fd,void *__buf,size_t __n)

{
  int64_t diff;
  long local_18;
  
  for (local_18 = ((ulong)(uint)__fd - this->prev) + -1; 0x7f < local_18; local_18 = local_18 >> 7)
  {
    this->out_bytes = this->out_bytes + 1;
    std::ostream::put((char)this->out);
  }
  this->out_bytes = this->out_bytes + 1;
  std::ostream::put((char)this->out);
  this->prev = (ulong)(uint)__fd;
  return (ssize_t)this;
}

Assistant:

void RunWriter::write(FileId next) {
    assert(next > prev);
    int64_t diff = (next - prev) - 1;
    while (diff >= 0x80U) {
        out_bytes++;
        out->put(static_cast<uint8_t>(0x80U | (diff & 0x7FU)));
        diff >>= 7;
    }
    out_bytes++;
    out->put(static_cast<uint8_t>(diff));
    prev = next;
}